

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Vec_Wec_t * Gia_MiniAigSuperGates(Mini_Aig_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar4;
  Vec_Int_t *vRes;
  int iVar5;
  
  iVar1 = Mini_AigPoNum(p);
  p_00 = (Vec_Wec_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p_00->nCap = iVar5;
  iVar2 = 0;
  if (iVar5 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar5,0x10);
  }
  p_00->pArray = pVVar4;
  p_00->nSize = iVar1;
  pVVar4 = Vec_IntStartFull(p->nSize / 2);
  for (iVar5 = 1; iVar5 < p->nSize / 2; iVar5 = iVar5 + 1) {
    iVar1 = Mini_AigNodeIsPi(p,iVar5);
    if (iVar1 != 0) {
      Vec_IntWriteEntry(pVVar4,iVar5,iVar2);
      iVar2 = iVar2 + 1;
    }
  }
  iVar5 = Mini_AigPiNum(p);
  if (iVar2 == iVar5) {
    iVar5 = 1;
    iVar1 = 0;
    do {
      if (p->nSize / 2 <= iVar5) {
        iVar5 = Mini_AigPoNum(p);
        if (iVar1 == iVar5) {
          Vec_IntFree(pVVar4);
          return p_00;
        }
        __assert_fail("Index == Mini_AigPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x34a,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
      }
      iVar2 = Mini_AigNodeIsPo(p,iVar5);
      if (iVar2 != 0) {
        iVar2 = Mini_AigNodeFanin0(p,iVar5);
        iVar3 = Abc_LitIsCompl(iVar2);
        if (iVar3 != 0) {
          __assert_fail("!Abc_LitIsCompl(iFan0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                        ,0x347,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
        }
        iVar2 = Abc_Lit2Var(iVar2);
        vRes = Vec_WecEntry(p_00,iVar1);
        Gia_MiniAigSuperGates_rec(p,iVar2,vRes,pVVar4);
        iVar1 = iVar1 + 1;
      }
      iVar5 = iVar5 + 1;
    } while( true );
  }
  __assert_fail("Index == Mini_AigPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                ,0x342,"Vec_Wec_t *Gia_MiniAigSuperGates(Mini_Aig_t *)");
}

Assistant:

Vec_Wec_t * Gia_MiniAigSuperGates( Mini_Aig_t * p )
{
    Vec_Wec_t * vRes = Vec_WecStart( Mini_AigPoNum(p) );
    Vec_Int_t * vMap = Vec_IntStartFull( Mini_AigNodeNum(p) );
    int i, Index = 0;
    Mini_AigForEachPi( p, i )
        Vec_IntWriteEntry( vMap, i, Index++ );
    assert( Index == Mini_AigPiNum(p) );
    Index = 0;
    Mini_AigForEachPo( p, i )
    {
        int iFan0 = Mini_AigNodeFanin0( p, i );
        assert( !Abc_LitIsCompl(iFan0) );
        Gia_MiniAigSuperGates_rec( p, Abc_Lit2Var(iFan0), Vec_WecEntry(vRes, Index++), vMap );
    }
    assert( Index == Mini_AigPoNum(p) );
    Vec_IntFree( vMap );
    return vRes;
}